

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O1

void __thiscall CVmObjFrameRef::CVmObjFrameRef(CVmObjFrameRef *this,vm_val_t *fp,uchar *entry)

{
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  vm_obj_id_t vVar5;
  vm_obj_id_t vVar6;
  vm_frameref_ext *pvVar7;
  long lVar8;
  anon_union_8_8_cb74652f_for_val *paVar9;
  uint uVar10;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  CVmFuncPtr f;
  CVmFuncPtr local_38;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_0032a0f0;
  uVar1 = *(ushort *)(entry + 2);
  iVar13 = fp[-2].val.intval;
  (this->super_CVmObject).ext_ = (char *)0x0;
  local_38.p_ = entry;
  pvVar7 = alloc_ext(this,(uint)uVar1,iVar13);
  pvVar7->fp = fp;
  pvVar7->entryp = entry;
  CVmFuncPtr::get_fnptr(&local_38,&pvVar7->entry);
  auVar4 = _DAT_00299d30;
  uVar10 = iVar13 + (uint)uVar1;
  if (uVar10 != 0 && SCARRY4(iVar13,(uint)uVar1) == (int)uVar10 < 0) {
    uVar11 = (ulong)(uVar10 + 3 & 0xfffffffc);
    lVar8 = (ulong)uVar10 - 1;
    auVar12._8_4_ = (int)lVar8;
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
    paVar9 = (anon_union_8_8_cb74652f_for_val *)&pvVar7[1].nlocals;
    auVar12 = auVar12 ^ _DAT_00299d30;
    auVar14 = _DAT_00299d20;
    auVar15 = _DAT_00299670;
    do {
      auVar16 = auVar15 ^ auVar4;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar13 && auVar12._0_4_ < auVar16._0_4_ ||
                  iVar13 < auVar16._4_4_) & 1)) {
        paVar9[-6].obj = 1;
      }
      if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
          auVar16._12_4_ <= auVar12._12_4_) {
        *(undefined4 *)&((vm_frameref_ext *)(paVar9 + -4))->fp = 1;
      }
      auVar16 = auVar14 ^ auVar4;
      iVar17 = auVar16._4_4_;
      if (iVar17 <= iVar13 && (iVar17 != iVar13 || auVar16._0_4_ <= auVar12._0_4_)) {
        paVar9[-2].obj = 1;
        paVar9->obj = 1;
      }
      lVar8 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar8 + 4;
      lVar8 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar8 + 4;
      paVar9 = paVar9 + 8;
      uVar11 = uVar11 - 4;
    } while (uVar11 != 0);
  }
  uVar3 = *(undefined4 *)&fp[-8].field_0x4;
  aVar2 = fp[-8].val;
  (pvVar7->self).typ = fp[-8].typ;
  *(undefined4 *)&(pvVar7->self).field_0x4 = uVar3;
  (pvVar7->self).val = aVar2;
  vVar5 = 0;
  vVar6 = 0;
  if (fp[-9].typ == VM_OBJ) {
    vVar6 = fp[-9].val.obj;
  }
  pvVar7->defobj = vVar6;
  if (fp[-10].typ != VM_NIL) {
    vVar5 = fp[-10].val.obj;
  }
  pvVar7->targobj = vVar5;
  vVar6 = 0;
  if (fp[-9].typ == VM_OBJ) {
    vVar6 = fp[-9].val.obj;
  }
  pvVar7->defobj = vVar6;
  return;
}

Assistant:

CVmObjFrameRef::CVmObjFrameRef(VMG_ vm_val_t *fp,
                               const uchar *entry)
{
    /* set up a function pointer */
    CVmFuncPtr f(entry);

    /* 
     *   figure the total number of variable snapshot slots we need to
     *   allocate: this is the number of local variables plus the number of
     *   actual arguments 
     */
    int nlocals = f.get_local_cnt();
    int nparams = G_interpreter->get_argc_from_frame(vmg_ fp);

    /* allocate our extension */
    ext_ = 0;
    vm_frameref_ext *ext = alloc_ext(vmg_ nlocals, nparams);

    /* save the extra frame information */
    ext->fp = fp;
    ext->entryp = entry;

    /* get the function pointer value for the entry pointer */
    f.get_fnptr(vmg_ &ext->entry);

    /* initialize the variable slots to nil */
    for (int i = 0 ; i < nlocals + nparams ; ++i)
        ext->vars[i].set_nil();

    /* 
     *   save the method context variables - these are immutable, so we can
     *   save them immediately 
     */
    ext->self = *G_interpreter->get_self_val_from_frame(vmg_ fp);
    ext->defobj = G_interpreter->get_defining_obj_from_frame(vmg_ fp);
    ext->targobj = G_interpreter->get_orig_target_obj_from_frame(vmg_ fp);
    ext->defobj = G_interpreter->get_defining_obj_from_frame(vmg_ fp);
}